

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateJavascriptOperatorsIsConstructorGotoElse
          (Lowerer *this,Instr *instrInsert,RegOpnd *instanceRegOpnd,LabelInstr *labelReturnTrue,
          LabelInstr *labelReturnFalse)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  LabelInstr *target;
  LabelInstr *target_00;
  RegOpnd *baseOpnd;
  RegOpnd *dst;
  undefined4 *puVar3;
  IndirOpnd *pIVar4;
  IntConstOpnd *pIVar5;
  Lowerer *pLVar6;
  
  func = instrInsert->m_func;
  target = InsertLoopTopLabel(this,instrInsert);
  target_00 = IR::LabelInstr::New(Label,func,false);
  baseOpnd = IR::RegOpnd::New(TyUint64,func);
  dst = IR::RegOpnd::New(TyUint32,func);
  if ((target->field_0x78 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  BVSparse<Memory::JitArenaAllocator>::Set
            ((target->m_loop->regAlloc).liveOnBackEdgeSyms,(instanceRegOpnd->m_sym->super_Sym).m_id)
  ;
  pIVar4 = IR::IndirOpnd::New(instanceRegOpnd,8,TyUint64,func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar4->super_Opnd,instrInsert,true);
  offset = Js::Type::GetOffsetOfTypeId();
  pIVar4 = IR::IndirOpnd::New(baseOpnd,offset,TyUint32,func,false);
  InsertMove(&dst->super_Opnd,&pIVar4->super_Opnd,instrInsert,true);
  pLVar6 = (Lowerer *)0x1a;
  pIVar5 = IR::IntConstOpnd::New(0x1a,TyUint32,func,true);
  InsertCompareBranch(pLVar6,&dst->super_Opnd,&pIVar5->super_Opnd,BrNeq_A,false,target_00,
                      instrInsert,false);
  pIVar4 = IR::IndirOpnd::New(instanceRegOpnd,0x28,TyUint64,func,false);
  InsertMove(&instanceRegOpnd->super_Opnd,&pIVar4->super_Opnd,instrInsert,true);
  InsertBranch(Br,false,target,instrInsert);
  IR::Instr::InsertBefore(instrInsert,&target_00->super_Instr);
  pLVar6 = (Lowerer *)0x1b;
  pIVar5 = IR::IntConstOpnd::New(0x1b,TyUint32,func,true);
  InsertCompareBranch(pLVar6,&dst->super_Opnd,&pIVar5->super_Opnd,BrNeq_A,false,labelReturnFalse,
                      instrInsert,false);
  pIVar4 = IR::IndirOpnd::New(instanceRegOpnd,0x28,TyUint64,func,false);
  InsertMove(&baseOpnd->super_Opnd,&pIVar4->super_Opnd,instrInsert,true);
  pIVar4 = IR::IndirOpnd::New(baseOpnd,0x18,TyUint32,func,false);
  InsertMove(&dst->super_Opnd,&pIVar4->super_Opnd,instrInsert,true);
  pIVar5 = IR::IntConstOpnd::New(1,TyUint32,func,true);
  InsertTest(&dst->super_Opnd,&pIVar5->super_Opnd,instrInsert);
  InsertBranch(BrNeq_A,false,labelReturnFalse,instrInsert);
  InsertBranch(Br,false,labelReturnTrue,instrInsert);
  return;
}

Assistant:

void
Lowerer::GenerateJavascriptOperatorsIsConstructorGotoElse(IR::Instr *instrInsert, IR::RegOpnd *instanceRegOpnd, IR::LabelInstr *labelReturnTrue, IR::LabelInstr *labelReturnFalse)
{
    //  $ProxyLoop:
    //  // if (!VarIs<RecyclableObject>(instance)) { goto $ReturnFalse }; // omitted: VarIs<RecyclableObject>(instance) always true
    //  MOV s0, instance->type
    //  MOV s1, s0->typeId
    //  CMP s1, TypeIds_Proxy
    //  JNE $NotProxy
    //
    //  MOV instance, instance->target
    //  JMP $ProxyLoop
    //
    //  $NotProxy:
    //  CMP s1, TypeIds_Function
    //  JNE $ReturnFalse   // external
    //
    //  MOV s0, instance->functionInfo
    //  MOV s1, s0->attributes
    //  TEST s1, ErrorOnNew
    //  JNE $ReturnFalse   // external
    //
    //  JMP $ReturnTrue    // external

    Func *func = instrInsert->m_func;

    IR::LabelInstr *labelProxyLoop = InsertLoopTopLabel(instrInsert);

    IR::LabelInstr *labelNotProxy = IR::LabelInstr::New(Js::OpCode::Label, func, false);

    IR::RegOpnd *indir0RegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    IR::RegOpnd *indir1RegOpnd = IR::RegOpnd::New(TyUint32, func);

    Loop * loop = labelProxyLoop->GetLoop();
    loop->regAlloc.liveOnBackEdgeSyms->Set(instanceRegOpnd->m_sym->m_id);

    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, func);
    Lowerer::InsertMove(indir0RegOpnd, indirOpnd, instrInsert);

    indirOpnd = IR::IndirOpnd::New(indir0RegOpnd, Js::Type::GetOffsetOfTypeId(), TyUint32, func);
    Lowerer::InsertMove(indir1RegOpnd, indirOpnd, instrInsert);

    InsertCompareBranch(indir1RegOpnd, IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyUint32, func, true), Js::OpCode::BrNeq_A, labelNotProxy, instrInsert);

    indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::JavascriptProxy::GetOffsetOfTarget(), TyMachPtr, func);
    Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instrInsert);

    InsertBranch(Js::OpCode::Br, labelProxyLoop, instrInsert);

    instrInsert->InsertBefore(labelNotProxy);

    InsertCompareBranch(indir1RegOpnd, IR::IntConstOpnd::New(Js::TypeIds_Function, TyUint32, func, true), Js::OpCode::BrNeq_A, labelReturnFalse, instrInsert);

    indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::JavascriptFunction::GetOffsetOfFunctionInfo(), TyMachPtr, func);
    Lowerer::InsertMove(indir0RegOpnd, indirOpnd, instrInsert);

    indirOpnd = IR::IndirOpnd::New(indir0RegOpnd, Js::FunctionInfo::GetAttributesOffset(), TyUint32, func);
    Lowerer::InsertMove(indir1RegOpnd, indirOpnd, instrInsert);

    InsertTestBranch(indir1RegOpnd, IR::IntConstOpnd::New(Js::FunctionInfo::Attributes::ErrorOnNew, TyUint32, func, true), Js::OpCode::BrNeq_A, labelReturnFalse, instrInsert);

    InsertBranch(Js::OpCode::Br, labelReturnTrue, instrInsert);
}